

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldLiteGenerator::GenerateMembers
          (ImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  FieldDescriptor *pFVar1;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"private int $name$_;\n");
  PrintExtraFieldInfo(variables,printer);
  pFVar1 = this->descriptor_;
  if (*(int *)(*(long *)(pFVar1 + 0x30) + 0x8c) != 3) {
    WriteFieldDocComment(printer,pFVar1);
    io::Printer::Print(printer,variables,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $get_has_field_bit_message$;\n}\n"
                      );
    pFVar1 = this->descriptor_;
    if (*(int *)(*(long *)(pFVar1 + 0x30) + 0x8c) != 3) goto LAB_002c5718;
  }
  WriteFieldDocComment(printer,pFVar1);
  io::Printer::Print(printer,variables,
                     "$deprecation$public int get$capitalized_name$Value() {\n  return $name$_;\n}\n"
                    );
  pFVar1 = this->descriptor_;
LAB_002c5718:
  WriteFieldDocComment(printer,pFVar1);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  $type$ result = $type$.forNumber($name$_);\n  return result == null ? $unknown$ : result;\n}\n"
                    );
  pFVar1 = this->descriptor_;
  if (*(int *)(*(long *)(pFVar1 + 0x30) + 0x8c) == 3) {
    WriteFieldDocComment(printer,pFVar1);
    io::Printer::Print(printer,variables,
                       "private void set$capitalized_name$Value(int value) {\n  $set_has_field_bit_message$  $name$_ = value;\n}\n"
                      );
    pFVar1 = this->descriptor_;
  }
  WriteFieldDocComment(printer,pFVar1);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$($type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  $set_has_field_bit_message$\n  $name$_ = value.getNumber();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  $clear_has_field_bit_message$\n  $name$_ = $default_number$;\n}\n"
                    );
  return;
}

Assistant:

void ImmutableEnumFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private int $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $get_has_field_bit_message$;\n"
      "}\n");
  }
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public int get$capitalized_name$Value() {\n"
      "  return $name$_;\n"
      "}\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  $type$ result = $type$.forNumber($name$_);\n"
    "  return result == null ? $unknown$ : result;\n"
    "}\n");

  // Generate private setters for the builder to proxy into.
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "private void set$capitalized_name$Value(int value) {\n"
      "  $set_has_field_bit_message$"
      "  $name$_ = value;\n"
      "}\n");
  }
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$($type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  $set_has_field_bit_message$\n"
    "  $name$_ = value.getNumber();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  $clear_has_field_bit_message$\n"
    "  $name$_ = $default_number$;\n"
    "}\n");
}